

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000172200 = 0x2d2d2d2d2d2d2d;
    uRam0000000000172207 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001721f0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001721f8 = 0x2d2d2d2d2d2d2d;
    DAT_001721ff = 0x2d;
    _DAT_001721e0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001721e8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001721d0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001721d8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001721c8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017220f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << '\n';
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }